

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

void __thiscall File::~File(File *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (this->hasParser == true) {
    ts_tree_delete(this->tree);
    ts_parser_delete(this->parser);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert(&(this->utf).converter);
  TextBuffer::~TextBuffer(&this->buffer);
  pcVar2 = (this->languageId)._M_dataplus._M_p;
  paVar1 = &(this->languageId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Uri::Uri::~Uri(&this->uri);
  return;
}

Assistant:

File::~File () {
    if (hasParser) {
        ts_tree_delete(tree);
        ts_parser_delete(parser);
    }
}